

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  char *pcVar2;
  int ret;
  _func_bool *p_Var3;
  _func_bool_bool *test;
  
  p_Var3 = (_func_bool *)0x0;
  pcVar2 = GF2::Env::Version();
  GF2::Env::Print("gf2/test [gf2 version %s]\n",pcVar2);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  test = (_func_bool_bool *)
         CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,test,false);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)test >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)test);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  p_Var3 = (_func_bool *)
           CONCAT44((int)((ulong)p_Var3 >> 0x20),(uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3);
  bVar1 = GF2::Env::RunTest(_ret,p_Var3);
  return (uint)((bVar1 ^ 0xffU) & 1) | (uint)p_Var3;
}

Assistant:

int main()
{
	int ret = 0;
	Env::Print("gf2/test [gf2 version %s]\n", Env::Version());
	ret |= !Env::RunTest("testWW", testWW);
	ret |= !Env::RunTest("testMP", testMP);
	ret |= !Env::RunTest("testOder", testOrder);
	ret |= !Env::RunTest("testBFunc", testBFunc);
	ret |= !Env::RunTest("testBent", testBent);
	ret |= !Env::RunTest("testBent2", testBent2);
	ret |= !Env::RunTest("testGOST", testGOST);
	ret |= !Env::RunTest("testBelt", testBelt, true);
	ret |= !Env::RunTest("testBash", testBash);
	ret |= !Env::RunTest("testBash2", testBash2);
	ret |= !Env::RunTest("testCommute", testCommute);
	ret |= !Env::RunTest("testEM", testEM);
	return ret;
}